

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pid.c
# Opt level: O0

inform_pid_source * alloc_source(size_t *name,inform_error *err)

{
  size_t *psVar1;
  inform_pid_source **ppiVar2;
  size_t *local_name;
  inform_pid_source *src;
  inform_error *err_local;
  size_t *name_local;
  
  if (name == (size_t *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_EARG;
    }
    name_local = (size_t *)0x0;
  }
  else {
    name_local = (size_t *)malloc(0x40);
    if ((inform_pid_source *)name_local == (inform_pid_source *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      name_local = (size_t *)0x0;
    }
    else {
      ((inform_pid_source *)name_local)->name = (size_t *)0x0;
      ((inform_pid_source *)name_local)->below = (inform_pid_source **)0x0;
      ((inform_pid_source *)name_local)->above = (inform_pid_source **)0x0;
      psVar1 = (size_t *)gvector_dup(name);
      if (psVar1 == (size_t *)0x0) {
        free_source((inform_pid_source *)name_local);
        if (err != (inform_error *)0x0) {
          *err = INFORM_ENOMEM;
        }
        name_local = (size_t *)0x0;
      }
      else {
        ((inform_pid_source *)name_local)->name = psVar1;
        psVar1 = (size_t *)gvector_shrink(((inform_pid_source *)name_local)->name);
        if (psVar1 == (size_t *)0x0) {
          free_source((inform_pid_source *)name_local);
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          name_local = (size_t *)0x0;
        }
        else {
          ((inform_pid_source *)name_local)->name = psVar1;
          ((inform_pid_source *)name_local)->size = ((inform_pid_source *)name_local)->name[-1];
          ppiVar2 = (inform_pid_source **)gvector_alloc(0,0,8);
          ((inform_pid_source *)name_local)->above = ppiVar2;
          if (((inform_pid_source *)name_local)->above == (inform_pid_source **)0x0) {
            free_source((inform_pid_source *)name_local);
            if (err != (inform_error *)0x0) {
              *err = INFORM_ENOMEM;
            }
            name_local = (size_t *)0x0;
          }
          else {
            ((inform_pid_source *)name_local)->n_above = 0;
            ppiVar2 = (inform_pid_source **)gvector_alloc(0,0,8);
            ((inform_pid_source *)name_local)->below = ppiVar2;
            if (((inform_pid_source *)name_local)->below == (inform_pid_source **)0x0) {
              free_source((inform_pid_source *)name_local);
              if (err != (inform_error *)0x0) {
                *err = INFORM_ENOMEM;
              }
              name_local = (size_t *)0x0;
            }
            else {
              ((inform_pid_source *)name_local)->n_below = 0;
              ((inform_pid_source *)name_local)->pi = 0.0;
              ((inform_pid_source *)name_local)->imin = 0.0;
            }
          }
        }
      }
    }
  }
  return (inform_pid_source *)name_local;
}

Assistant:

static inform_pid_source *alloc_source(size_t *name,
        inform_error *err)
{
    if (!name)
    {
        INFORM_ERROR_RETURN(err, INFORM_EARG, NULL);
    }

    inform_pid_source *src = malloc(sizeof(inform_pid_source));
    if (!src)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    src->name = NULL;
    src->above = src->below = NULL;

    size_t *local_name = gvector_dup(name);
    if (!local_name)
    {
        free_source(src);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    src->name = local_name;

    local_name = gvector_shrink(src->name);
    if (!local_name)
    {
        free_source(src);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    src->name = local_name;
    src->size = gvector_len(src->name);

    src->above = gvector_alloc(0, 0, sizeof(inform_pid_source*));
    if (!src->above)
    {
        free_source(src);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    src->n_above = 0;

    src->below = gvector_alloc(0, 0, sizeof(inform_pid_source*));
    if (!src->below)
    {
        free_source(src);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    src->n_below = 0;

    src->imin = src->pi = 0.0;

    return src;
}